

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O1

void sapp_set_mouse_cursor(sapp_mouse_cursor cursor)

{
  if (cursor < _SAPP_MOUSECURSOR_NUM) {
    if (_sapp.mouse.current_cursor != cursor) {
      _sapp_x11_update_cursor(cursor,_sapp.mouse.shown);
      _sapp.mouse.current_cursor = cursor;
    }
    return;
  }
  __assert_fail("(cursor >= 0) && (cursor < _SAPP_MOUSECURSOR_NUM)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                ,0x2ef7,"void sapp_set_mouse_cursor(sapp_mouse_cursor)");
}

Assistant:

SOKOL_API_IMPL void sapp_set_mouse_cursor(sapp_mouse_cursor cursor) {
    SOKOL_ASSERT((cursor >= 0) && (cursor < _SAPP_MOUSECURSOR_NUM));
    if (_sapp.mouse.current_cursor != cursor) {
        #if defined(_SAPP_MACOS)
        _sapp_macos_update_cursor(cursor, _sapp.mouse.shown);
        #elif defined(_SAPP_WIN32)
        _sapp_win32_update_cursor(cursor, _sapp.mouse.shown, false);
        #elif defined(_SAPP_LINUX)
        _sapp_x11_update_cursor(cursor, _sapp.mouse.shown);
        #elif defined(_SAPP_UWP)
        _sapp_uwp_update_cursor(cursor, _sapp.mouse.shown);
        #elif defined(_SAPP_EMSCRIPTEN)
        _sapp_emsc_update_cursor(cursor, _sapp.mouse.shown);
        #endif
        _sapp.mouse.current_cursor = cursor;
    }
}